

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O1

uint64 CityHash64WithSeeds(char *s,size_t len,uint64 seed0,uint64 seed1)

{
  uint64 uVar1;
  ulong uVar2;
  
  uVar1 = CityHash64(s,len);
  uVar2 = (uVar1 - seed0 ^ seed1) * -0x622015f714c7d297;
  uVar2 = (uVar2 >> 0x2f ^ seed1 ^ uVar2) * -0x622015f714c7d297;
  return (uVar2 ^ uVar2 >> 0x2f) * -0x622015f714c7d297;
}

Assistant:

uint64 CityHash64WithSeeds(const char *s, size_t len,
                           uint64 seed0, uint64 seed1) {
  return HashLen16(CityHash64(s, len) - seed0, seed1);
}